

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamHeaderValidator_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::SamHeaderValidator::ContainsUniqueIDsAndPlatformUnits(SamHeaderValidator *this)

{
  bool bVar1;
  iterator this_00;
  long *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar2;
  string *pu;
  string *id;
  SamReadGroup *rg;
  SamReadGroupConstIterator rgEnd;
  SamReadGroupConstIterator rgIter;
  SamReadGroupDictionary *readGroups;
  iterator puIter;
  iterator idIter;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  platformUnits;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  readGroupIds;
  bool isValid;
  undefined6 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3e;
  byte bVar3;
  undefined1 in_stack_fffffffffffffe3f;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe40;
  iterator in_stack_fffffffffffffe48;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe58;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe89;
  string local_170 [8];
  string *in_stack_fffffffffffffe98;
  SamHeaderValidator *in_stack_fffffffffffffea0;
  string local_150 [32];
  _Self local_130;
  _Base_ptr local_128;
  string *local_120;
  _Base_ptr local_118;
  undefined1 local_110;
  string local_108 [32];
  string local_e8 [32];
  _Self local_c8;
  _Base_ptr local_c0;
  string *local_b8;
  reference local_b0;
  SamReadGroup *local_a8;
  __normal_iterator<const_BamTools::SamReadGroup_*,_std::vector<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>_>
  local_90;
  long local_88;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78 [13];
  byte local_9;
  
  local_9 = 1;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x1e8e01);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x1e8e0e);
  std::
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Rb_tree_const_iterator(local_78);
  std::
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Rb_tree_const_iterator(&local_80);
  local_88 = *in_RDI + 0xc0;
  local_90._M_current =
       (SamReadGroup *)
       SamReadGroupDictionary::ConstBegin
                 ((SamReadGroupDictionary *)
                  CONCAT17(in_stack_fffffffffffffe3f,
                           CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)));
  local_a8 = (SamReadGroup *)
             SamReadGroupDictionary::ConstEnd
                       ((SamReadGroupDictionary *)
                        CONCAT17(in_stack_fffffffffffffe3f,
                                 CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_BamTools::SamReadGroup_*,_std::vector<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>_>
                             *)in_stack_fffffffffffffe40._M_node,
                            (__normal_iterator<const_BamTools::SamReadGroup_*,_std::vector<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>_>
                             *)CONCAT17(in_stack_fffffffffffffe3f,
                                        CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38
                                                ))), bVar1) {
    local_b0 = __gnu_cxx::
               __normal_iterator<const_BamTools::SamReadGroup_*,_std::vector<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>_>
               ::operator*(&local_90);
    local_b8 = &local_b0->ID;
    this_00 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(in_stack_fffffffffffffe48._M_node,in_stack_fffffffffffffe40._M_node);
    local_c0 = this_00._M_node;
    local_78[0]._M_node = this_00._M_node;
    local_c8._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffe3f,
                           CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)));
    bVar1 = std::operator!=(local_78,&local_c8);
    if (bVar1) {
      std::operator+((char *)CONCAT71(in_stack_fffffffffffffe89,in_stack_fffffffffffffe88),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe80._M_node);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe48._M_node,(char *)in_stack_fffffffffffffe40._M_node);
      AddError(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::~string(local_108);
      local_9 = 0;
    }
    pVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this_00._M_node,(value_type *)in_stack_fffffffffffffe58._M_node);
    in_stack_fffffffffffffe58 = pVar2.first._M_node;
    local_110 = pVar2.second;
    local_120 = &local_b0->PlatformUnit;
    local_118 = in_stack_fffffffffffffe58._M_node;
    in_stack_fffffffffffffe48 =
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(in_stack_fffffffffffffe48._M_node,in_stack_fffffffffffffe40._M_node);
    local_128 = in_stack_fffffffffffffe48._M_node;
    local_80._M_node = in_stack_fffffffffffffe48._M_node;
    local_130._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffe3f,
                           CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)));
    bVar1 = std::operator!=(&local_80,&local_130);
    if (bVar1) {
      std::operator+((char *)CONCAT71(in_stack_fffffffffffffe89,in_stack_fffffffffffffe88),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe80._M_node);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe48._M_node,(char *)in_stack_fffffffffffffe40._M_node);
      AddError(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      std::__cxx11::string::~string(local_150);
      std::__cxx11::string::~string(local_170);
      local_9 = 0;
    }
    pVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this_00._M_node,(value_type *)in_stack_fffffffffffffe58._M_node);
    in_stack_fffffffffffffe40 = pVar2.first._M_node;
    in_stack_fffffffffffffe3f = pVar2.second;
    in_stack_fffffffffffffe80._M_node = in_stack_fffffffffffffe40._M_node;
    in_stack_fffffffffffffe88 = in_stack_fffffffffffffe3f;
    __gnu_cxx::
    __normal_iterator<const_BamTools::SamReadGroup_*,_std::vector<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>_>
    ::operator++(&local_90);
  }
  bVar3 = local_9;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1e91c1);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1e91ce);
  return (bool)(bVar3 & 1);
}

Assistant:

bool SamHeaderValidator::ContainsUniqueIDsAndPlatformUnits(void) {

    bool isValid = true;
    set<string> readGroupIds;
    set<string> platformUnits;
    set<string>::iterator idIter;
    set<string>::iterator puIter;

    // iterate over sequences
    const SamReadGroupDictionary& readGroups = m_header.ReadGroups;
    SamReadGroupConstIterator rgIter = readGroups.ConstBegin();
    SamReadGroupConstIterator rgEnd  = readGroups.ConstEnd();
    for ( ; rgIter != rgEnd; ++rgIter ) {
        const SamReadGroup& rg = (*rgIter);

        // --------------------------------
        // check for unique ID

        // lookup read group ID
        const string& id = rg.ID;
        idIter = readGroupIds.find(id);

        // error if found (duplicate entry)
        if ( idIter != readGroupIds.end() ) {
            AddError("Read group ID (ID): " + id + " is not unique");
            isValid = false;
        }

        // otherwise ok, store id
        readGroupIds.insert(id);

        // --------------------------------
        // check for unique platform unit

        // lookup platform unit
        const string& pu = rg.PlatformUnit;
        puIter = platformUnits.find(pu);

        // error if found (duplicate entry)
        if ( puIter != platformUnits.end() ) {
            AddError("Platform unit (PU): " + pu + " is not unique");
            isValid = false;
        }

        // otherwise ok, store platform unit
        platformUnits.insert(pu);
    }

    // return validation state
    return isValid;
}